

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O1

void __thiscall PcodeOp::printDebug(PcodeOp *this,ostream *s)

{
  ostream *poVar1;
  
  poVar1 = operator<<(s,&this->start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if (((this->flags & 0x20) == 0) && (this->parent != (BlockBasic *)0x0)) {
    (*this->opcode->_vptr_TypeOp[10])(this->opcode,s,this);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"**",2);
  return;
}

Assistant:

void PcodeOp::printDebug(ostream &s) const

{
  s << start << ": ";
  if (isDead()||(parent==(BlockBasic *)0))
    s << "**";
  else
    printRaw(s);
}